

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopItemFlag(void)

{
  ImGuiWindow *pIVar1;
  int iVar2;
  uint uVar3;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  iVar2 = (pIVar1->DC).ItemFlagsStack.Size;
  if (iVar2 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                  ,0x544,"void ImVector<int>::pop_back() [T = int]");
  }
  uVar3 = iVar2 - 1;
  (pIVar1->DC).ItemFlagsStack.Size = uVar3;
  if (uVar3 == 0) {
    iVar2 = 0;
  }
  else {
    if (iVar2 == 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x538,"T &ImVector<int>::back() [T = int]");
    }
    iVar2 = (pIVar1->DC).ItemFlagsStack.Data[(ulong)uVar3 - 1];
  }
  (pIVar1->DC).ItemFlags = iVar2;
  return;
}

Assistant:

void ImGui::PopItemFlag()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ItemFlagsStack.pop_back();
    window->DC.ItemFlags = window->DC.ItemFlagsStack.empty() ? ImGuiItemFlags_Default_ : window->DC.ItemFlagsStack.back();
}